

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.c
# Opt level: O0

void free_memory(argon2_context *context,argon2_instance_t *instance)

{
  ulong n;
  size_t memory_size;
  argon2_instance_t *instance_local;
  argon2_context *context_local;
  
  n = (ulong)(instance->memory_blocks << 10);
  clear_internal_memory(instance->memory,n);
  if (instance->keep_memory == 0) {
    if (context->free_cbk == (deallocate_fptr)0x0) {
      free(instance->memory);
    }
    else {
      (*context->free_cbk)((uint8_t *)instance->memory,n);
    }
  }
  return;
}

Assistant:

void free_memory(const argon2_context *context,
                 const argon2_instance_t *instance) {
    size_t memory_size = instance->memory_blocks * ARGON2_BLOCK_SIZE;

    clear_internal_memory(instance->memory, memory_size);

    if (instance->keep_memory) {
        /* user-supplied memory -- do not free */
        return;
    }

    if (context->free_cbk) {
        (context->free_cbk)((uint8_t *)instance->memory, memory_size);
    } else {
        free(instance->memory);
    }
}